

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray_my.h
# Opt level: O2

uint32_t __thiscall PackedArray_my<17U,_2048U>::get(PackedArray_my<17U,_2048U> *this,uint offset)

{
  uint uVar1;
  sbyte sVar2;
  uint uVar3;
  
  uVar1 = offset * 0x11 >> 5;
  uVar3 = offset * 0x11 & 0x1f;
  sVar2 = (sbyte)uVar3;
  if (uVar3 < 0x10) {
    uVar1 = this->buf[uVar1] >> sVar2;
  }
  else {
    uVar1 = (uint)(*(ulong *)(this->buf + uVar1) >> sVar2);
  }
  return uVar1 & this->mask;
}

Assistant:

uint32_t get(unsigned offset) {
        unsigned cell = offset*bits / 32;
        unsigned start_bit = (offset*bits) % 32;
        if(start_bit <= (32 - bits) ) {
            return mask & (buf[cell] >> start_bit);
        } else {
            uint64_t &x = (uint64_t&)buf[cell];
            return mask & (x >> start_bit);
        }
    }